

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

bool basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint16_t packed_delta3,uint32_t table_idx)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  
  if (table_idx < 8) {
    uVar4 = (ulong)table_idx;
    bVar3 = unpack_color5(&r,&g,&b,packed_color5,packed_delta3,true,0xff);
    iVar1 = (&g_etc1_inten_tables)[uVar4 * 4];
    iVar2 = (&DAT_003099e4)[uVar4 * 4];
    color_rgba::set(pDst,iVar1 + r,iVar1 + g,iVar1 + b,0xff);
    color_rgba::set(pDst + 1,iVar2 + r,iVar2 + g,iVar2 + b,0xff);
    iVar1 = *(int *)(&DAT_003099e8 + uVar4 * 0x10);
    color_rgba::set(pDst + 2,iVar1 + r,iVar1 + g,iVar1 + b,0xff);
    iVar1 = *(int *)(&DAT_003099ec + uVar4 * 0x10);
    color_rgba::set(pDst + 3,r + iVar1,g + iVar1,iVar1 + b,0xff);
    return bVar3;
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x22e,
                "static bool basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint16_t, uint32_t)"
               );
}

Assistant:

bool etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint16_t packed_delta3, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);

		return success;
	}